

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::startsWith(ProString *this,QChar c,CaseSensitivity cs)

{
  bool bVar1;
  undefined4 in_EDX;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  QStringView *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  QStringView *n;
  qsizetype in_stack_ffffffffffffffb8;
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RDI;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),&local_18);
  QVar2 = QStringView::mid(in_RDI,in_stack_ffffffffffffffb8,(qsizetype)n);
  bVar1 = QStringView::startsWith
                    (in_stack_ffffffffffffff88,(QChar)QVar2.m_size._6_2_,CaseInsensitive);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool startsWith(QChar c, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().startsWith(c, cs); }